

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

void clearexp(void)

{
  expentry *peVar1;
  expentry *__ptr;
  exphead *peVar2;
  
  if (ehead.tqh_first != (expentry *)0x0) {
    do {
      __ptr = ehead.tqh_first;
      peVar1 = ((ehead.tqh_first)->eentry).tqe_next;
      peVar2 = (exphead *)peVar1;
      if (peVar1 == (expentry *)0x0) {
        peVar2 = &ehead;
      }
      (((expentry *)peVar2)->eentry).tqe_prev = ((ehead.tqh_first)->eentry).tqe_prev;
      *(__ptr->eentry).tqe_prev = peVar1;
      free(__ptr->fun);
      free(__ptr);
    } while (ehead.tqh_first != (expentry *)0x0);
  }
  return;
}

Assistant:

static void
clearexp(void)
{
	struct expentry	*e1 = NULL;

	while (!TAILQ_EMPTY(&ehead)) {
		e1 = TAILQ_FIRST(&ehead);
		TAILQ_REMOVE(&ehead, e1, eentry);
		free(e1->fun);
		free(e1);
	}
	return;
}